

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fixed_size_allocator.cpp
# Opt level: O1

void __thiscall
duckdb::FixedSizeAllocator::FixedSizeAllocator
          (FixedSizeAllocator *this,idx_t segment_size,BlockManager *block_manager)

{
  optional_idx *this_00;
  idx_t iVar1;
  idx_t iVar2;
  ulong uVar3;
  InternalException *this_01;
  ulong uVar4;
  ulong uVar5;
  optional_idx *this_02;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  this->block_manager = block_manager;
  this->buffer_manager = block_manager->buffer_manager;
  this->segment_size = segment_size;
  this->total_segment_count = 0;
  (this->buffers)._M_h._M_buckets = &(this->buffers)._M_h._M_single_bucket;
  (this->buffers)._M_h._M_bucket_count = 1;
  (this->buffers)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->buffers)._M_h._M_element_count = 0;
  (this->buffers)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->buffers)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->buffers)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->buffers_with_free_space)._M_h._M_buckets =
       &(this->buffers_with_free_space)._M_h._M_single_bucket;
  (this->buffers_with_free_space)._M_h._M_bucket_count = 1;
  (this->buffers_with_free_space)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->buffers_with_free_space)._M_h._M_element_count = 0;
  (this->buffers_with_free_space)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->buffers_with_free_space)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->buffers_with_free_space)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->buffer_with_free_space).index = 0xffffffffffffffff;
  (this->vacuum_buffers)._M_h._M_buckets = &(this->vacuum_buffers)._M_h._M_single_bucket;
  (this->vacuum_buffers)._M_h._M_bucket_count = 1;
  (this->vacuum_buffers)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->vacuum_buffers)._M_h._M_element_count = 0;
  (this->vacuum_buffers)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->vacuum_buffers)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->vacuum_buffers)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  this_00 = &block_manager->block_alloc_size;
  iVar1 = optional_idx::GetIndex(this_00);
  this_02 = &block_manager->block_header_size;
  iVar2 = optional_idx::GetIndex(this_02);
  if ((iVar1 - iVar2) - 8 < segment_size) {
    this_01 = (InternalException *)__cxa_allocate_exception(0x10);
    iVar1 = optional_idx::GetIndex(this_00);
    iVar2 = optional_idx::GetIndex(this_02);
    std::__cxx11::to_string(&local_70,(iVar1 - iVar2) - 8);
    ::std::operator+(&local_50,"The maximum segment size of fixed-size allocators is ",&local_70);
    InternalException::InternalException(this_01,&local_50);
    __cxa_throw(this_01,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
  }
  uVar4 = 0;
  this->bitmask_count = 0;
  this->available_segments_per_buffer = 0;
  do {
    iVar1 = optional_idx::GetIndex(this_00);
    iVar2 = optional_idx::GetIndex(this_02);
    if (iVar1 - iVar2 <= uVar4) break;
    iVar1 = this->bitmask_count;
    if ((iVar1 == 0) || ((iVar1 << 6) % this->available_segments_per_buffer == 0)) {
      this->bitmask_count = iVar1 + 1;
      uVar4 = uVar4 + 8;
    }
    iVar1 = optional_idx::GetIndex(this_00);
    iVar2 = optional_idx::GetIndex(this_02);
    uVar5 = iVar1 - (iVar2 + uVar4);
    if (segment_size <= uVar5) {
      uVar3 = uVar5 / segment_size;
      if (0x3f < uVar3) {
        uVar3 = 0x40;
      }
      this->available_segments_per_buffer = this->available_segments_per_buffer + uVar3;
      uVar4 = uVar4 + uVar3 * segment_size;
    }
  } while (segment_size <= uVar5);
  this->bitmask_offset = this->bitmask_count << 3;
  return;
}

Assistant:

FixedSizeAllocator::FixedSizeAllocator(const idx_t segment_size, BlockManager &block_manager)
    : block_manager(block_manager), buffer_manager(block_manager.buffer_manager), segment_size(segment_size),
      total_segment_count(0) {

	if (segment_size > block_manager.GetBlockSize() - sizeof(validity_t)) {
		throw InternalException("The maximum segment size of fixed-size allocators is " +
		                        to_string(block_manager.GetBlockSize() - sizeof(validity_t)));
	}

	// calculate how many segments fit into one buffer (available_segments_per_buffer)

	idx_t bits_per_value = sizeof(validity_t) * 8;
	idx_t byte_count = 0;

	bitmask_count = 0;
	available_segments_per_buffer = 0;

	while (byte_count < block_manager.GetBlockSize()) {
		if (!bitmask_count || (bitmask_count * bits_per_value) % available_segments_per_buffer == 0) {
			// we need to add another validity_t value to the bitmask, to allow storing another
			// bits_per_value segments on a buffer
			bitmask_count++;
			byte_count += sizeof(validity_t);
		}

		auto remaining_bytes = block_manager.GetBlockSize() - byte_count;
		auto remaining_segments = MinValue(remaining_bytes / segment_size, bits_per_value);

		if (remaining_segments == 0) {
			break;
		}

		available_segments_per_buffer += remaining_segments;
		byte_count += remaining_segments * segment_size;
	}

	bitmask_offset = bitmask_count * sizeof(validity_t);
}